

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * __thiscall
cxxopts::(anonymous_namespace)::format_description_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,HelpOptionDetails *o,
          size_t start,size_t width)

{
  bool bVar1;
  reference pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  allocator<char> local_161;
  String local_160;
  size_t local_140;
  char *local_138;
  char *local_130;
  allocator<char> local_121;
  String local_120;
  char *local_100;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  char *local_f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  ulong local_e0;
  size_t size;
  iterator lastSpace;
  iterator startLine;
  iterator current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  String desc;
  size_t width_local;
  size_t start_local;
  HelpOptionDetails *o_local;
  String *result;
  
  desc.field_2._8_8_ = start;
  std::__cxx11::string::string((string *)local_48,(string *)(this + 0x40));
  if ((((byte)this[0x60] & 1) != 0) &&
     ((((byte)this[0xd1] & 1) == 0 ||
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (this + 0x68),"false"), bVar1)))) {
    std::operator+(&local_b8," (default: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this + 0x68));
    std::operator+(&local_98,&local_b8,")");
    toLocalString<std::__cxx11::string>(&local_78,(cxxopts *)&local_98,t);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  size = (size_t)std::begin<std::__cxx11::string>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48);
  local_e0 = 0;
  lastSpace = (iterator)size;
  startLine = (iterator)size;
  while( true ) {
    local_e8._M_current =
         (char *)std::end<std::__cxx11::string>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48);
    bVar1 = __gnu_cxx::operator!=(&startLine,&local_e8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&startLine);
    if (*pcVar2 == ' ') {
      size = (size_t)startLine._M_current;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&startLine);
    if (*pcVar2 == '\n') {
      local_f0 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&startLine,1);
      size = (size_t)local_f0;
      lastSpace._M_current = local_f0;
    }
    else if ((ulong)desc.field_2._8_8_ < local_e0) {
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&size,&lastSpace);
      if (bVar1) {
        local_f8._M_current = lastSpace._M_current;
        local_100 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator+(&startLine,1);
        stringAppend<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (__return_storage_ptr__,local_f8,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_100);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"\n",&local_121);
        stringAppend(__return_storage_ptr__,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
        stringAppend(__return_storage_ptr__,(size_t)o,' ');
        local_130 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator+(&startLine,1);
        size = (size_t)local_130;
        lastSpace._M_current = local_130;
      }
      else {
        local_138 = lastSpace._M_current;
        local_140 = size;
        stringAppend<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (__return_storage_ptr__,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )lastSpace._M_current,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )size);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"\n",&local_161);
        stringAppend(__return_storage_ptr__,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        stringAppend(__return_storage_ptr__,(size_t)o,' ');
        lastSpace._M_current =
             (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&size,1);
      }
      local_e0 = 0;
    }
    else {
      local_e0 = local_e0 + 1;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&startLine);
  }
  stringAppend<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (__return_storage_ptr__,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )lastSpace._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )startLine._M_current);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

String
    format_description
    (
      const HelpOptionDetails& o,
      size_t start,
      size_t width
    )
    {
      auto desc = o.desc;

      if (o.has_default && (!o.is_boolean || o.default_value != "false"))
      {
        desc += toLocalString(" (default: " + o.default_value + ")");
      }

      String result;

      auto current = std::begin(desc);
      auto startLine = current;
      auto lastSpace = current;

      auto size = size_t{};

      while (current != std::end(desc))
      {
        if (*current == ' ')
        {
          lastSpace = current;
        }

        if (*current == '\n')
        {
          startLine = current + 1;
          lastSpace = startLine;
        }
        else if (size > width)
        {
          if (lastSpace == startLine)
          {
            stringAppend(result, startLine, current + 1);
            stringAppend(result, "\n");
            stringAppend(result, start, ' ');
            startLine = current + 1;
            lastSpace = startLine;
          }
          else
          {
            stringAppend(result, startLine, lastSpace);
            stringAppend(result, "\n");
            stringAppend(result, start, ' ');
            startLine = lastSpace + 1;
          }
          size = 0;
        }
        else
        {
          ++size;
        }

        ++current;
      }

      //append whatever is left
      stringAppend(result, startLine, current);

      return result;
    }